

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_compact_cell_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  REF_INT *pRVar4;
  REF_GLOB **ppRVar5;
  REF_STATUS RVar6;
  uint uVar7;
  REF_GLOB *pRVar8;
  void *array;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  REF_MPI ref_mpi;
  int iVar16;
  REF_INT nnode;
  REF_INT part;
  REF_INT nodes [27];
  uint local_dc;
  REF_NODE local_d8;
  REF_GLOB **local_d0;
  int local_c4;
  ulong *local_c0;
  REF_MPI local_b8;
  long *local_b0;
  REF_INT local_a8 [30];
  
  local_d8 = ref_grid->node;
  iVar15 = local_d8->max;
  if ((long)iVar15 < 0) {
    pcVar14 = "malloc *l2c of REF_GLOB negative";
    uVar10 = 0x1ed;
LAB_0015e5d1:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar10,
           "ref_grid_compact_cell_nodes",pcVar14);
    uVar7 = 1;
  }
  else {
    ref_mpi = ref_grid->mpi;
    __size = (long)iVar15 * 8;
    local_c0 = (ulong *)ncell_global;
    pRVar8 = (REF_GLOB *)malloc(__size);
    *l2c = pRVar8;
    if (pRVar8 == (REF_GLOB *)0x0) {
      pcVar14 = "malloc *l2c of REF_GLOB NULL";
      uVar10 = 0x1ed;
LAB_0015e604:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar10
             ,"ref_grid_compact_cell_nodes",pcVar14);
      return 2;
    }
    if (iVar15 != 0) {
      memset(pRVar8,0xff,__size);
    }
    uVar12 = 0;
    *nnode_global = 0;
    *local_c0 = 0;
    local_dc = 0;
    local_d0 = l2c;
    if (0 < ref_cell->max) {
      iVar15 = 0;
      iVar16 = 0;
      local_b8 = ref_mpi;
      local_b0 = nnode_global;
      do {
        RVar6 = ref_cell_nodes(ref_cell,iVar15,local_a8);
        if (RVar6 == 0) {
          uVar7 = ref_cell_part(ref_cell,local_d8,iVar15,&local_c4);
          if (uVar7 != 0) {
            pcVar14 = "part";
            uVar10 = 0x1f5;
            goto LAB_0015e6a5;
          }
          iVar16 = iVar16 + (uint)(local_b8->id == local_c4);
          iVar1 = ref_cell->node_per;
          if (0 < (long)iVar1) {
            pRVar4 = local_d8->part;
            iVar2 = local_d8->ref_mpi->id;
            lVar13 = 0;
            do {
              iVar3 = local_a8[lVar13];
              if ((iVar2 == pRVar4[iVar3]) && ((*local_d0)[iVar3] == -1)) {
                (*local_d0)[iVar3] = (long)(int)uVar12;
                local_dc = (int)uVar12 + 1;
                uVar12 = (ulong)local_dc;
              }
              lVar13 = lVar13 + 1;
            } while (iVar1 != lVar13);
          }
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < ref_cell->max);
      uVar12 = (ulong)iVar16;
      ref_mpi = local_b8;
      nnode_global = local_b0;
    }
    *local_c0 = uVar12;
    uVar7 = ref_mpi_allsum(ref_mpi,local_c0,1,2);
    if (uVar7 == 0) {
      if ((long)ref_mpi->n < 0) {
        pcVar14 = "malloc counts of REF_INT negative";
        uVar10 = 0x204;
        goto LAB_0015e5d1;
      }
      array = malloc((long)ref_mpi->n << 2);
      if (array == (void *)0x0) {
        pcVar14 = "malloc counts of REF_INT NULL";
        uVar10 = 0x204;
        goto LAB_0015e604;
      }
      uVar7 = ref_mpi_allgather(ref_mpi,&local_dc,array,1);
      ppRVar5 = local_d0;
      if (uVar7 == 0) {
        if ((long)ref_mpi->id < 1) {
          lVar13 = 0;
        }
        else {
          lVar9 = 0;
          lVar13 = 0;
          do {
            lVar13 = lVar13 + *(int *)((long)array + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (ref_mpi->id != lVar9);
        }
        if (0 < (long)ref_mpi->n) {
          lVar9 = *nnode_global;
          lVar11 = 0;
          do {
            lVar9 = lVar9 + *(int *)((long)array + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (ref_mpi->n != lVar11);
          *nnode_global = lVar9;
        }
        free(array);
        iVar15 = local_d8->max;
        pRVar8 = *ppRVar5;
        if (0 < (long)iVar15) {
          lVar9 = 0;
          do {
            if (pRVar8[lVar9] != -1) {
              pRVar8[lVar9] = pRVar8[lVar9] + lVar13;
            }
            lVar9 = lVar9 + 1;
          } while (iVar15 != lVar9);
        }
        uVar7 = ref_node_ghost_glob(local_d8,pRVar8,1);
        if (uVar7 == 0) {
          return 0;
        }
        pcVar14 = "xfer";
        uVar10 = 0x213;
      }
      else {
        pcVar14 = "gather size";
        uVar10 = 0x205;
      }
    }
    else {
      pcVar14 = "allsum";
      uVar10 = 0x202;
    }
LAB_0015e6a5:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar10,
           "ref_grid_compact_cell_nodes",(ulong)uVar7,pcVar14);
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_cell_nodes(REF_GRID ref_grid,
                                               REF_CELL ref_cell,
                                               REF_GLOB *nnode_global,
                                               REF_LONG *ncell_global,
                                               REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_GLOB offset;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell++;
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (ref_node_owned(ref_node, nodes[cell_node]) &&
          (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
        (*l2c)[nodes[cell_node]] = nnode;
        nnode++;
      }
    }
  }
  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }